

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_solve_dense.c
# Opt level: O0

lu_int basiclu_solve_dense(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux
                          ,lu_int *Wi,double *Wx,double *rhs,double *lhs,char trans)

{
  long in_RCX;
  long in_RDX;
  double *in_RSI;
  lu_int *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  lu_int status;
  lu this;
  lu_int *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  lu_int *in_stack_fffffffffffffd10;
  double *in_stack_fffffffffffffd18;
  lu_int *in_stack_fffffffffffffd20;
  lu *in_stack_fffffffffffffd28;
  double *in_stack_fffffffffffffd40;
  lu_int *in_stack_fffffffffffffd48;
  double *in_stack_fffffffffffffd50;
  int local_28c;
  char in_stack_fffffffffffffdaf;
  double *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  lu *in_stack_fffffffffffffdc0;
  lu_int local_4;
  
  local_4 = lu_load(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                    in_stack_fffffffffffffd10,
                    (double *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                    in_stack_fffffffffffffd00,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
                    in_stack_fffffffffffffd50);
  if (local_4 == 0) {
    if (((((in_RDX == 0) || (in_RCX == 0)) || (in_R8 == 0)) ||
        ((in_R9 == 0 || (in_stack_00000008 == 0)))) ||
       ((in_stack_00000010 == 0 || ((in_stack_00000018 == 0 || (in_stack_00000020 == 0)))))) {
      local_4 = -3;
    }
    else if (local_28c < 0) {
      local_4 = -2;
    }
    else {
      lu_solve_dense(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffdaf);
    }
    local_4 = lu_save(&stack0xfffffffffffffd10,in_RDI,in_RSI,local_4);
  }
  return local_4;
}

Assistant:

lu_int basiclu_solve_dense
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    const double rhs[],
    double lhs[],
    char trans
)
{
    struct lu this;
    lu_int status;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && rhs && lhs))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else
    {
        lu_solve_dense(&this, rhs, lhs, trans);
    }

    return lu_save(&this, istore, xstore, status);
}